

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GeomPrimvar::
get_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
          (GeomPrimvar *this,double timecode,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *dest,
          TimeSampleInterpolationType interp,string *err)

{
  bool bVar1;
  uint32_t tyid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_120;
  uint32_t local_100;
  allocator local_f9;
  string local_f8 [32];
  string local_d8;
  undefined1 local_b8 [8];
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> value;
  allocator local_79;
  string local_78 [32];
  fmt local_58 [32];
  string *local_38;
  string *err_local;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *pvStack_28;
  TimeSampleInterpolationType interp_local;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *dest_local;
  double timecode_local;
  GeomPrimvar *this_local;
  
  local_38 = err;
  err_local._4_4_ = interp;
  pvStack_28 = dest;
  dest_local = (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
               timecode;
  timecode_local = (double)this;
  if (dest == (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Output value is nullptr.");
    }
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = Attribute::is_blocked(&this->_attr);
    if (bVar1) {
      if (local_38 != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)local_38,"Attribute is blocked.");
      }
      this_local._7_1_ = 0;
    }
    else {
      tyid = Attribute::type_id(&this->_attr);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (bVar1) {
        memset(local_b8,0,0x18);
        ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   local_b8);
        bVar1 = Attribute::
                get_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                            *)local_b8,err_local._4_4_);
        if (bVar1) {
          ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
          operator=(pvStack_28,
                    (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                    local_b8);
          this_local._7_1_ = 1;
        }
        else {
          if (local_38 != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_f8,
                       "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                       ,&local_f9);
            local_100 = tinyusdz::value::
                        TypeTraits<std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>_>
                        ::type_id();
            Attribute::type_name_abi_cxx11_(&local_120,&this->_attr);
            fmt::format<double,unsigned_int,std::__cxx11::string>
                      (&local_d8,(fmt *)local_f8,(string *)&dest_local,(double *)&local_100,
                       (uint *)&local_120,in_R9);
            ::std::__cxx11::string::operator+=((string *)local_38,(string *)&local_d8);
            ::std::__cxx11::string::~string((string *)&local_d8);
            ::std::__cxx11::string::~string((string *)&local_120);
            ::std::__cxx11::string::~string(local_f8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          }
          this_local._7_1_ = 0;
        }
        ::std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::~vector
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   local_b8);
      }
      else {
        if (local_38 != (string *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_78,"Unsupported type for GeomPrimvar. type = `{}`",&local_79);
          Attribute::type_name_abi_cxx11_
                    ((string *)
                     &value.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->_attr);
          fmt::format<std::__cxx11::string>
                    (local_58,(string *)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &value.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::__cxx11::string::operator+=((string *)local_38,(string *)local_58);
          ::std::__cxx11::string::~string((string *)local_58);
          ::std::__cxx11::string::~string
                    ((string *)
                     &value.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::__cxx11::string::~string(local_78);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        this_local._7_1_ = 0;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}